

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void swrenderer::R_InitShadeMaps(void)

{
  byte *pbVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int k;
  
  puVar2 = &shadetables;
  iVar3 = 0x20;
  iVar4 = 0x10;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    lVar9 = lVar7 * 0x20;
    *(undefined4 *)(&DAT_0074d338 + lVar9) = 0xffffffff;
    *(undefined4 *)(&DAT_0074d340 + lVar9) = 0xffffffff;
    *(undefined8 *)(&DAT_0074d348 + lVar9) = 0;
    (&ShadeFakeColormap)[lVar7 * 4] = puVar2;
    iVar8 = 0;
    uVar10 = 0x2000;
    while( true ) {
      if (iVar8 == 0x20) break;
      iVar11 = (int)(uVar10 >> 5);
      uVar5 = iVar3 * iVar11 + 0x100;
      for (lVar9 = 0; lVar9 != 0x100; lVar9 = lVar9 + 1) {
        bVar6 = (byte)(uVar5 >> 0xe);
        if (0x3f < bVar6) {
          bVar6 = 0x40;
        }
        puVar2[lVar9] = bVar6;
        uVar5 = uVar5 + iVar11 * iVar4;
      }
      puVar2 = puVar2 + 0x100;
      iVar8 = iVar8 + 1;
      uVar10 = uVar10 - 0x100;
    }
    iVar3 = iVar3 + -2;
    iVar4 = iVar4 + -1;
  }
  lVar7 = 0;
  do {
    if (lVar7 == 0x20000) {
      for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
        (&identitymap)[lVar7] = (char)lVar7;
      }
      identitycolormap = &identitymap;
      return;
    }
    pbVar1 = &shadetables + lVar7;
    lVar7 = lVar7 + 1;
  } while (*pbVar1 < 0x41);
  __assert_fail("shadetables[i] <= 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_draw.cpp"
                ,0xa8,"void swrenderer::R_InitShadeMaps()");
}

Assistant:

void R_InitShadeMaps()
	{
		int i, j;
		// set up shading tables for shaded columns
		// 16 colormap sets, progressing from full alpha to minimum visible alpha

		uint8_t *table = shadetables;

		// Full alpha
		for (i = 0; i < 16; ++i)
		{
			ShadeFakeColormap[i].Color = ~0u;
			ShadeFakeColormap[i].Desaturate = ~0u;
			ShadeFakeColormap[i].Next = NULL;
			ShadeFakeColormap[i].Maps = table;

			for (j = 0; j < NUMCOLORMAPS; ++j)
			{
				int a = (NUMCOLORMAPS - j) * 256 / NUMCOLORMAPS * (16 - i);
				for (int k = 0; k < 256; ++k)
				{
					uint8_t v = (((k + 2) * a) + 256) >> 14;
					table[k] = MIN<uint8_t>(v, 64);
				}
				table += 256;
			}
		}
		for (i = 0; i < NUMCOLORMAPS * 16 * 256; ++i)
		{
			assert(shadetables[i] <= 64);
		}

		// Set up a guaranteed identity map
		for (i = 0; i < 256; ++i)
		{
			identitymap[i] = i;
		}
		identitycolormap.Maps = identitymap;
	}